

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

void __thiscall ACSStringPool::Dump(ACSStringPool *this)

{
  PoolEntry *pPVar1;
  long lVar2;
  ulong uVar3;
  
  if ((this->Pool).Count != 0) {
    lVar2 = 0x10;
    uVar3 = 0;
    do {
      pPVar1 = (this->Pool).Array;
      if (*(int *)((long)pPVar1 + lVar2 + -4) != -2) {
        Printf("%4u. (%2d) \"%s\"\n",uVar3 & 0xffffffff,
               (ulong)*(uint *)((long)&(pPVar1->Str).Chars + lVar2),
               *(undefined8 *)((long)pPVar1 + lVar2 + -0x10));
      }
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x18;
    } while (uVar3 < (this->Pool).Count);
  }
  Printf("First free %u\n",(ulong)this->FirstFreeEntry);
  return;
}

Assistant:

void ACSStringPool::Dump() const
{
	for (unsigned int i = 0; i < Pool.Size(); ++i)
	{
		if (Pool[i].Next != FREE_ENTRY)
		{
			Printf("%4u. (%2d) \"%s\"\n", i, Pool[i].LockCount, Pool[i].Str.GetChars());
		}
	}
	Printf("First free %u\n", FirstFreeEntry);
}